

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::registerNonConstFuncs(Builtins *this)

{
  PredefinedIntegerType *__args_2;
  PredefinedIntegerType *__args_2_00;
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  undefined1 local_408 [32];
  undefined1 local_3e8 [28];
  undefined1 local_3cc [4];
  undefined1 local_3c8 [24];
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> intArg;
  shared_ptr<slang::ast::SystemSubroutine> local_398;
  shared_ptr<slang::ast::SystemSubroutine> local_388;
  shared_ptr<slang::ast::SystemSubroutine> local_378;
  shared_ptr<slang::ast::SystemSubroutine> local_368;
  shared_ptr<slang::ast::SystemSubroutine> local_358;
  shared_ptr<slang::ast::SystemSubroutine> local_348;
  shared_ptr<slang::ast::SystemSubroutine> local_338;
  shared_ptr<slang::ast::SystemSubroutine> local_328;
  shared_ptr<slang::ast::SystemSubroutine> local_318;
  shared_ptr<slang::ast::SystemSubroutine> local_308;
  shared_ptr<slang::ast::SystemSubroutine> local_2f8;
  shared_ptr<slang::ast::SystemSubroutine> local_2e8;
  shared_ptr<slang::ast::SystemSubroutine> local_2d8;
  shared_ptr<slang::ast::SystemSubroutine> local_2c8;
  shared_ptr<slang::ast::SystemSubroutine> local_2b8;
  shared_ptr<slang::ast::SystemSubroutine> local_2a8;
  shared_ptr<slang::ast::SystemSubroutine> local_298;
  shared_ptr<slang::ast::SystemSubroutine> local_288;
  shared_ptr<slang::ast::SystemSubroutine> local_278;
  shared_ptr<slang::ast::SystemSubroutine> local_268;
  shared_ptr<slang::ast::SystemSubroutine> local_258;
  shared_ptr<slang::ast::SystemSubroutine> local_248;
  shared_ptr<slang::ast::SystemSubroutine> local_238;
  shared_ptr<slang::ast::SystemSubroutine> local_228;
  shared_ptr<slang::ast::SystemSubroutine> local_218;
  shared_ptr<slang::ast::SystemSubroutine> local_208;
  shared_ptr<slang::ast::SystemSubroutine> local_1f8;
  shared_ptr<slang::ast::SystemSubroutine> local_1e8;
  shared_ptr<slang::ast::SystemSubroutine> local_1d8;
  shared_ptr<slang::ast::SystemSubroutine> local_1c8;
  shared_ptr<slang::ast::SystemSubroutine> local_1b8;
  shared_ptr<slang::ast::SystemSubroutine> local_1a8;
  shared_ptr<slang::ast::SystemSubroutine> local_198;
  shared_ptr<slang::ast::SystemSubroutine> local_188;
  shared_ptr<slang::ast::SystemSubroutine> local_178;
  shared_ptr<slang::ast::SystemSubroutine> local_168;
  shared_ptr<slang::ast::SystemSubroutine> local_158;
  shared_ptr<slang::ast::SystemSubroutine> local_148;
  shared_ptr<slang::ast::SystemSubroutine> local_138;
  shared_ptr<slang::ast::SystemSubroutine> local_128;
  shared_ptr<slang::ast::SystemSubroutine> local_118;
  shared_ptr<slang::ast::SystemSubroutine> local_108;
  shared_ptr<slang::ast::SystemSubroutine> local_f8;
  shared_ptr<slang::ast::SystemSubroutine> local_e8;
  shared_ptr<slang::ast::SystemSubroutine> local_d8;
  shared_ptr<slang::ast::SystemSubroutine> local_c8;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  shared_ptr<slang::ast::SystemSubroutine> local_38;
  
  __args_2 = &this->intType;
  __l._M_len = 1;
  __l._M_array = (iterator)local_408;
  local_408._0_8_ = __args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&intArg,__l,(allocator_type *)local_3c8);
  local_3c8._0_4_ = AnonymousProgram;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8);
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = NetAlias;
  __args_2_00 = &this->uintType;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = ConfigBlock;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::FloatingType&>
            ((KnownSystemName *)local_408,(FloatingType *)local_3c8);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SyntaxNode *)0x0;
  addSystemSubroutine(this,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = ConfigBlock|Root;
  local_3e8._0_4_ = Unknown;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3e8);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = 0x66;
  local_3e8._0_8_ = (ulong)(uint)local_3e8._4_4_ << 0x20;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3e8);
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3cc = (undefined1  [4])0x67;
  local_3e8._24_4_ = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_3e8;
  local_3e8._0_8_ = __args_2_00;
  local_3e8._8_8_ = __args_2_00;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_408,__l_00,(allocator_type *)(local_408 + 0x1f));
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_3c8,(PredefinedIntegerType *)local_3cc,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_3e8 + 0x18));
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3c8._0_8_;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_;
  local_3c8._0_8_ = (Type *)0x0;
  local_3c8._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )local_408);
  local_3cc = (undefined1  [4])0x45;
  local_3e8._24_4_ = 1;
  local_3e8._0_8_ = &this->stringType;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_3e8;
  local_3e8._8_8_ = local_3e8._0_8_;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_408,__l_01,(allocator_type *)(local_408 + 0x1f));
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_3c8,(PredefinedIntegerType *)local_3cc,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_3e8 + 0x18));
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3c8._0_8_;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_;
  local_3c8._0_8_ = (Type *)0x0;
  local_3c8._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )local_408);
  local_3c8._0_4_ = Iterator;
  local_3e8._0_4_ = Root;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)local_408,(VoidType *)local_3c8,(int *)&this->voidType,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3e8);
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Type *)0x0;
  addSystemSubroutine(this,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = 0x47;
  local_3e8._0_4_ = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3e8);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (SourceLocation)0x0;
  local_408._8_8_ = (Scope *)0x0;
  addSystemSubroutine(this,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3cc = (undefined1  [4])0x48;
  local_3e8._24_4_ = 2;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_3e8;
  local_3e8._0_8_ = __args_2;
  local_3e8._8_8_ = __args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_408,__l_02,(allocator_type *)(local_408 + 0x1f));
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_3c8,(PredefinedIntegerType *)local_3cc,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_3e8 + 0x18));
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3c8._0_8_;
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_;
  local_3c8._0_8_ = (Type *)0x0;
  local_3c8._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )local_408);
  local_3c8._0_4_ = 0x49;
  local_3e8._0_4_ = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3e8);
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3cc = (undefined1  [4])0x4a;
  local_3e8._24_4_ = 3;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_3c8;
  local_3c8._0_8_ = __args_2;
  local_3c8._8_8_ = __args_2;
  local_3c8._16_8_ = __args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_408,__l_03,(allocator_type *)(local_408 + 0x1f));
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_3e8,(PredefinedIntegerType *)local_3cc,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_3e8 + 0x18));
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3e8._0_8_;
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8._8_8_;
  local_3e8._0_8_ = (Type *)0x0;
  local_3e8._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3e8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )local_408);
  local_3c8._0_4_ = Primitive;
  local_3e8._0_4_ = Root;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3e8);
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PrimitivePort;
  local_3e8._0_4_ = Unknown;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)local_408,(VoidType *)local_3c8,(int *)&this->voidType,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3e8);
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SyntaxNode *)0x0;
  addSystemSubroutine(this,&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PrimitiveInstance;
  local_3e8._0_4_ = Root;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3e8);
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|ScalarType;
  local_3e8._0_4_ = Unknown;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8,(int *)__args_2);
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SourceLocation)0x0;
  addSystemSubroutine(this,&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|FloatingType;
  local_3e8._0_4_ = Unknown;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int>
            ((KnownSystemName *)local_408,(PredefinedIntegerType *)local_3c8,(int *)__args_2);
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|DynamicArrayType;
  local_3e8._0_4_ = CompilationUnit;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)local_408,(int *)local_3c8);
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|DPIOpenArrayType;
  local_3e8._0_4_ = CompilationUnit;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)local_408,(int *)local_3c8);
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Type *)0x0;
  addSystemSubroutine(this,&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|AssociativeArrayType;
  local_3e8._0_4_ = Definition;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)local_408,(int *)local_3c8);
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|QueueType;
  local_3e8._0_4_ = Definition;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)local_408,(int *)local_3c8);
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (SourceLocation)0x0;
  local_408._8_8_ = (Scope *)0x0;
  addSystemSubroutine(this,&local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|PackedStructType;
  local_3e8._0_4_ = Definition;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)local_408,(int *)local_3c8);
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|UnpackedStructType;
  local_3e8._0_4_ = Definition;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)local_408,(int *)local_3c8);
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|PackedUnionType;
  local_3e8._0_4_ = 3;
  std::make_shared<slang::ast::builtins::DistributionFunc,slang::parsing::KnownSystemName,int>
            ((KnownSystemName *)local_408,(int *)local_3c8);
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = SpecifyBlock;
  std::make_shared<slang::ast::builtins::ValueChangeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_408);
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SyntaxNode *)0x0;
  addSystemSubroutine(this,&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = Sequence;
  std::make_shared<slang::ast::builtins::ValueChangeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_408);
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = Property;
  std::make_shared<slang::ast::builtins::ValueChangeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_408);
  local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SourceLocation)0x0;
  addSystemSubroutine(this,&local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = AssertionPort;
  std::make_shared<slang::ast::builtins::ValueChangeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_408);
  local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = ClockingBlock;
  local_3e8._0_8_ = local_3e8._0_8_ & 0xffffffffffffff00;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = ClockVar;
  local_3e8._0_8_ = local_3e8._0_8_ & 0xffffffffffffff00;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Type *)0x0;
  addSystemSubroutine(this,&local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = LocalAssertionVar;
  local_3e8._0_8_ = local_3e8._0_8_ & 0xffffffffffffff00;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = LetDecl;
  local_3e8._0_8_ = local_3e8._0_8_ & 0xffffffffffffff00;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (SourceLocation)0x0;
  local_408._8_8_ = (Scope *)0x0;
  addSystemSubroutine(this,&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = Checker;
  local_3e8._0_8_ = local_3e8._0_8_ & 0xffffffffffffff00;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = CheckerInstance;
  local_3e8[0] = Root;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = CheckerInstanceBody;
  local_3e8[0] = Root;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = RandSeqProduction;
  local_3e8[0] = Root;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SyntaxNode *)0x0;
  addSystemSubroutine(this,&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = CovergroupBody;
  local_3e8[0] = Root;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = 0x5b;
  local_3e8[0] = Root;
  std::make_shared<slang::ast::builtins::GlobalValueChangeFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SourceLocation)0x0;
  addSystemSubroutine(this,&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::FErrorFunc>();
  local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::FGetsFunc>();
  local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8[0] = (allocator_type)0x1;
  std::make_shared<slang::ast::builtins::ScanfFunc,bool>((bool *)local_408);
  local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Type *)0x0;
  addSystemSubroutine(this,&local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_8_ = (ulong)(uint7)local_3c8._1_7_ << 8;
  std::make_shared<slang::ast::builtins::ScanfFunc,bool>((bool *)local_408);
  local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_2c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::FReadFunc>();
  local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (SourceLocation)0x0;
  local_408._8_8_ = (Scope *)0x0;
  addSystemSubroutine(this,&local_2d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::SampledFunc>();
  local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::PastFunc>();
  local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_2f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|EnumType;
  local_3e8[0] = Root;
  std::make_shared<slang::ast::builtins::TimeScaleFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_308);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = PulseStyle|EnumValue;
  local_3e8[0] = Root;
  std::make_shared<slang::ast::builtins::TimeScaleFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SyntaxNode *)0x0;
  addSystemSubroutine(this,&local_318);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = 0x6c;
  local_3e8._0_8_ = (ulong)(uint7)local_3e8._1_7_ << 8;
  std::make_shared<slang::ast::builtins::TimeScaleFunc,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_408,(bool *)local_3c8);
  local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (Symbol *)0x0;
  addSystemSubroutine(this,&local_328);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::StacktraceFunc>();
  local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (SourceLocation)0x0;
  addSystemSubroutine(this,&local_338);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::CountDriversFunc>();
  local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_348);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::GetPatternFunc>();
  local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_358);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::make_shared<slang::ast::builtins::TestPlusArgsFunction,slang::ast::builtins::Builtins&>
            ((Builtins *)local_408);
  local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (pointer)0x0;
  addSystemSubroutine(this,&local_368);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3cc = (undefined1  [4])0x0;
  local_408._16_8_ = (pointer)0x0;
  local_3e8._0_4_ = 0x3e;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3e8[0x18] = 1;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::ScalarType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>,bool>
            ((KnownSystemName *)local_3c8,(ScalarType *)local_3e8,(int *)this,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_3cc,(bool *)local_408);
  local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3c8._0_8_;
  local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._8_8_;
  local_3c8._0_8_ = (Type *)0x0;
  local_3c8._8_8_ = (Symbol *)0x0;
  addSystemMethod(this,EventType,&local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c8 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                )local_408);
  local_3c8._0_4_ = 0x11c;
  std::make_shared<slang::ast::builtins::RandModeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_408);
  local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (SourceLocation)0x0;
  local_408._8_8_ = (Scope *)0x0;
  addSystemMethod(this,ClassProperty,&local_388);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  local_3c8._0_4_ = 0x11d;
  std::make_shared<slang::ast::builtins::RandModeFunc,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_408);
  local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._0_8_;
  local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_;
  local_408._0_8_ = (Type *)0x0;
  local_408._8_8_ = (pointer)0x0;
  addSystemMethod(this,ConstraintBlock,&local_398);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_408 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&intArg.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               );
  return;
}

Assistant:

void Builtins::registerNonConstFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(...) addSystemSubroutine(std::make_shared<NonConstantFunction>(__VA_ARGS__))

    std::vector<const Type*> intArg = {&intType};

    REGISTER(KnownSystemName::Time, timeType);
    REGISTER(KnownSystemName::STime, uintType);
    REGISTER(KnownSystemName::RealTime, realTimeType);
    REGISTER(KnownSystemName::Random, intType, 0, intArg);
    REGISTER(KnownSystemName::URandom, uintType, 0, intArg);
    REGISTER(KnownSystemName::URandomRange, uintType, 1,
             std::vector<const Type*>{&uintType, &uintType});

    REGISTER(KnownSystemName::FOpen, intType, 1,
             std::vector<const Type*>{&stringType, &stringType});
    REGISTER(KnownSystemName::FClose, voidType, 1, intArg);
    REGISTER(KnownSystemName::FGetC, intType, 1, intArg);
    REGISTER(KnownSystemName::UngetC, intType, 2, std::vector<const Type*>{&intType, &intType});
    REGISTER(KnownSystemName::FTell, intType, 1, intArg);
    REGISTER(KnownSystemName::FSeek, intType, 3,
             std::vector<const Type*>{&intType, &intType, &intType});
    REGISTER(KnownSystemName::Rewind, intType, 1, intArg);
    REGISTER(KnownSystemName::FFlush, voidType, 0, intArg);
    REGISTER(KnownSystemName::FEof, intType, 1, intArg);

    REGISTER(KnownSystemName::ResetCount, intType, 0);
    REGISTER(KnownSystemName::ResetValue, intType, 0);

#undef REGISTER

#define FUNC(name, numArgs) addSystemSubroutine(std::make_shared<DistributionFunc>(name, numArgs))
    FUNC(KnownSystemName::DistUniform, 3);
    FUNC(KnownSystemName::DistNormal, 3);
    FUNC(KnownSystemName::DistExponential, 2);
    FUNC(KnownSystemName::DistPoisson, 2);
    FUNC(KnownSystemName::DistChiSquare, 2);
    FUNC(KnownSystemName::DistT, 2);
    FUNC(KnownSystemName::DistErlang, 3);
#undef FUNC

#define FUNC(name) addSystemSubroutine(std::make_shared<ValueChangeFunc>(name))
    FUNC(KnownSystemName::Rose);
    FUNC(KnownSystemName::Fell);
    FUNC(KnownSystemName::Stable);
    FUNC(KnownSystemName::Changed);
#undef FUNC

#define FUNC(name, isFuture) \
    addSystemSubroutine(std::make_shared<GlobalValueChangeFunc>(name, isFuture))
    FUNC(KnownSystemName::PastGclk, false);
    FUNC(KnownSystemName::RoseGclk, false);
    FUNC(KnownSystemName::FellGclk, false);
    FUNC(KnownSystemName::StableGclk, false);
    FUNC(KnownSystemName::ChangedGclk, false);
    FUNC(KnownSystemName::FutureGclk, true);
    FUNC(KnownSystemName::RisingGclk, true);
    FUNC(KnownSystemName::FallingGclk, true);
    FUNC(KnownSystemName::SteadyGclk, true);
    FUNC(KnownSystemName::ChangingGclk, true);
#undef FUNC

    addSystemSubroutine(std::make_shared<FErrorFunc>());
    addSystemSubroutine(std::make_shared<FGetsFunc>());
    addSystemSubroutine(std::make_shared<ScanfFunc>(true));
    addSystemSubroutine(std::make_shared<ScanfFunc>(false));
    addSystemSubroutine(std::make_shared<FReadFunc>());
    addSystemSubroutine(std::make_shared<SampledFunc>());
    addSystemSubroutine(std::make_shared<PastFunc>());
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::TimeUnit, true));
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::TimePrecision, true));
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::Scale, false));
    addSystemSubroutine(std::make_shared<StacktraceFunc>());
    addSystemSubroutine(std::make_shared<CountDriversFunc>());
    addSystemSubroutine(std::make_shared<GetPatternFunc>());
    addSystemSubroutine(std::make_shared<TestPlusArgsFunction>(*this));

    addSystemMethod(SymbolKind::EventType,
                    std::make_shared<NonConstantFunction>(KnownSystemName::Triggered, bitType, 0,
                                                          std::vector<const Type*>{},
                                                          /* isMethod */ true));

    addSystemMethod(SymbolKind::ClassProperty,
                    std::make_shared<RandModeFunc>(KnownSystemName::RandMode));
    addSystemMethod(SymbolKind::ConstraintBlock,
                    std::make_shared<RandModeFunc>(KnownSystemName::ConstraintMode));
}